

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIterator.cpp
# Opt level: O0

Var Js::JavascriptArrayIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  int64 instance;
  bool bVar2;
  int iVar3;
  CallFlags e;
  uint32 uVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  void **ppvVar7;
  CallInfo CVar8;
  Var pvVar9;
  Var value_00;
  undefined4 extraout_var;
  JavascriptArray *pJVar10;
  JavascriptArray *keyValueTuple;
  Var value;
  ulong local_90;
  int64 index;
  TypedArrayBase *typedArrayBase;
  JavascriptArray *pArr;
  int64 length;
  Var iterable;
  JavascriptArrayIterator *iterator;
  Var thisObj;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x1a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  library = (JavascriptLibrary *)RecyclableObject::GetScriptContext(function);
  bVar2 = ScriptContext::IsJsBuiltInEnabled((ScriptContext *)library);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x1e,"(!scriptContext->IsJsBuiltInEnabled())",
                                "!scriptContext->IsJsBuiltInEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  thisObj = ScriptContext::GetLibrary((ScriptContext *)library);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x23,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iterator = (JavascriptArrayIterator *)Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar2 = VarIs<Js::JavascriptArrayIterator>(iterator);
  if (!bVar2) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)library,-0x7ff5ebf4,L"Array Iterator.prototype.next");
  }
  iterable = VarTo<Js::JavascriptArrayIterator>(iterator);
  ppvVar7 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&((JavascriptArrayIterator *)iterable)->m_iterableObject);
  length = (int64)*ppvVar7;
  if ((Var)length == (Var)0x0) {
    CVar8 = (CallInfo)
            JavascriptLibrary::CreateIteratorResultObjectDone((JavascriptLibrary *)thisObj);
    return (Var)CVar8;
  }
  typedArrayBase = (TypedArrayBase *)0x0;
  index = 0;
  bVar2 = Js::JavascriptArray::IsNonES5Array((Var)length);
  if (bVar2) {
    pJVar10 = VarTo<Js::JavascriptArray>((Var)length);
    iVar3 = (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])();
    if (iVar3 == 0) {
      bVar2 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>((Var)length);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                    ,0x3a,"(!VarIs<JavascriptCopyOnAccessNativeIntArray>(iterable))"
                                    ,"!VarIs<JavascriptCopyOnAccessNativeIntArray>(iterable)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      typedArrayBase = (TypedArrayBase *)Js::JavascriptArray::FromAnyArray((Var)length);
      uVar4 = ArrayObject::GetLength((ArrayObject *)typedArrayBase);
      pArr = (JavascriptArray *)(ulong)uVar4;
      goto LAB_0111cc41;
    }
  }
  bVar2 = VarIs<Js::TypedArrayBase>((Var)length);
  if (bVar2) {
    index = (int64)UnsafeVarTo<Js::TypedArrayBase>((Var)length);
    bVar2 = Js::TypedArrayBase::IsDetachedBuffer((TypedArrayBase *)index);
    if (bVar2) {
      JavascriptError::ThrowTypeError((ScriptContext *)library,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    uVar4 = ArrayObject::GetLength((ArrayObject *)index);
    pArr = (JavascriptArray *)(ulong)uVar4;
  }
  else {
    pvVar9 = Js::JavascriptOperators::OP_GetLength((Var)length,(ScriptContext *)library);
    pArr = (JavascriptArray *)JavascriptConversion::ToLength(pvVar9,(ScriptContext *)library);
  }
LAB_0111cc41:
  pvVar9 = thisObj;
  instance = length;
  local_90 = *(ulong *)((long)iterable + 0x28);
  if ((long)local_90 < (long)pArr) {
    *(long *)((long)iterable + 0x28) = *(long *)((long)iterable + 0x28) + 1;
    if (*(int *)((long)iterable + 0x30) == 0) {
      value_00 = JavascriptNumber::ToVar(local_90,(ScriptContext *)library);
      callInfo_local =
           (CallInfo)
           JavascriptLibrary::CreateIteratorResultObject((JavascriptLibrary *)pvVar9,value_00,false)
      ;
    }
    else {
      if (typedArrayBase == (TypedArrayBase *)0x0) {
        if (index == 0) {
          pvVar9 = JavascriptNumber::ToVar(local_90,(ScriptContext *)library);
          keyValueTuple =
               (JavascriptArray *)
               Js::JavascriptOperators::OP_GetElementI
                         ((Var)instance,pvVar9,(ScriptContext *)library);
        }
        else {
          if (0xffffffff < (long)local_90) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                        ,0x67,"(index <= 0xffffffff)","index <= UINT_MAX");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          keyValueTuple =
               (JavascriptArray *)(**(code **)(*(long *)index + 0x390))(index,local_90 & 0xffffffff)
          ;
        }
      }
      else {
        if (0xffffffff < (long)local_90) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                      ,0x62,"(index <= 0xffffffff)","index <= UINT_MAX");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        iVar3 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,local_90 & 0xffffffff);
        keyValueTuple = (JavascriptArray *)CONCAT44(extraout_var,iVar3);
      }
      if (*(int *)((long)iterable + 0x30) == 1) {
        callInfo_local =
             (CallInfo)
             JavascriptLibrary::CreateIteratorResultObject
                       ((JavascriptLibrary *)thisObj,keyValueTuple,false);
      }
      else {
        if (*(int *)((long)iterable + 0x30) != 2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                      ,0x74,
                                      "(iterator->m_kind == JavascriptArrayIteratorKind::KeyAndValue)"
                                      ,
                                      "iterator->m_kind == JavascriptArrayIteratorKind::KeyAndValue"
                                     );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pJVar10 = JavascriptLibrary::CreateArray((JavascriptLibrary *)thisObj,2);
        pvVar9 = JavascriptNumber::ToVar(local_90,(ScriptContext *)library);
        (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (pJVar10,0,pvVar9);
        (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (pJVar10,1,keyValueTuple,0);
        callInfo_local =
             (CallInfo)
             JavascriptLibrary::CreateIteratorResultObject
                       ((JavascriptLibrary *)thisObj,pJVar10,false);
      }
    }
  }
  else {
    value = (Var)0x0;
    Memory::WriteBarrierPtr<void>::operator=
              ((WriteBarrierPtr<void> *)((long)iterable + 0x20),&value);
    callInfo_local =
         (CallInfo)JavascriptLibrary::CreateIteratorResultObjectDone((JavascriptLibrary *)thisObj);
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptArrayIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

#ifdef ENABLE_JS_BUILTINS
        Assert(!scriptContext->IsJsBuiltInEnabled());
#endif

        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptArrayIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedArrayIterator, _u("Array Iterator.prototype.next"));
        }

        JavascriptArrayIterator* iterator = VarTo<JavascriptArrayIterator>(thisObj);
        Var iterable = iterator->m_iterableObject;

        if (iterable == nullptr)
        {
            return library->CreateIteratorResultObjectDone();
        }

        int64 length;
        JavascriptArray* pArr = nullptr;
        TypedArrayBase *typedArrayBase = nullptr;
        if (JavascriptArray::IsNonES5Array(iterable) && !VarTo<JavascriptArray>(iterable)->IsCrossSiteObject())
        {
#if ENABLE_COPYONACCESS_ARRAY
            Assert(!VarIs<JavascriptCopyOnAccessNativeIntArray>(iterable));
#endif
            pArr = JavascriptArray::FromAnyArray(iterable);
            length = pArr->GetLength();
        }
        else if (VarIs<TypedArrayBase>(iterable))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(iterable);
            if (typedArrayBase->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray);
            }

            length = typedArrayBase->GetLength();
        }
        else
        {
            length = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(iterable, scriptContext), scriptContext);
        }

        int64 index = iterator->m_nextIndex;

        if (index >= length)
        {
            // Nulling out the m_iterableObject field is important so that the iterator
            // does not keep the iterable object alive after iteration is completed.
            iterator->m_iterableObject = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        iterator->m_nextIndex += 1;

        if (iterator->m_kind == JavascriptArrayIteratorKind::Key)
        {
            return library->CreateIteratorResultObject(JavascriptNumber::ToVar(index, scriptContext));
        }

        Var value;
        if (pArr != nullptr)
        {
            Assert(index <= UINT_MAX);
            value = pArr->DirectGetItem((uint32)index);
        }
        else if (typedArrayBase != nullptr)
        {
            Assert(index <= UINT_MAX);
            value = typedArrayBase->DirectGetItem((uint32)index);
        }
        else
        {
            value = JavascriptOperators::OP_GetElementI(iterable, JavascriptNumber::ToVar(index, scriptContext), scriptContext);
        }

        if (iterator->m_kind == JavascriptArrayIteratorKind::Value)
        {
            return library->CreateIteratorResultObject(value);
        }

        Assert(iterator->m_kind == JavascriptArrayIteratorKind::KeyAndValue);

        JavascriptArray* keyValueTuple = library->CreateArray(2);

        keyValueTuple->SetItem(0, JavascriptNumber::ToVar(index, scriptContext), PropertyOperation_None);
        keyValueTuple->SetItem(1, value, PropertyOperation_None);

        return library->CreateIteratorResultObject(keyValueTuple);
    }